

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O2

void vp8hwdBoolStart(vpBoolCoder_t *bit_ctx,RK_U8 *buffer,RK_U32 len)

{
  uint uVar1;
  
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x28,"vp8hwdBoolStart")
    ;
  }
  bit_ctx->lowvalue = 0;
  bit_ctx->range = 0xff;
  bit_ctx->count = 8;
  bit_ctx->pos = 0;
  bit_ctx->buffer = buffer;
  uVar1 = *(uint *)buffer;
  bit_ctx->value = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  bit_ctx->pos = 4;
  bit_ctx->streamEndPos = len;
  bit_ctx->strmError = (uint)(len < 4);
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x37,"vp8hwdBoolStart"
              );
  }
  return;
}

Assistant:

static void vp8hwdBoolStart(vpBoolCoder_t *bit_ctx, RK_U8 *buffer, RK_U32 len)
{
    FUN_T("FUN_IN");
    bit_ctx->lowvalue = 0;
    bit_ctx->range = 255;
    bit_ctx->count = 8;
    bit_ctx->buffer = buffer;
    bit_ctx->pos = 0;

    bit_ctx->value = (bit_ctx->buffer[0] << 24) + (bit_ctx->buffer[1] << 16)
                     + (bit_ctx->buffer[2] << 8) + (bit_ctx->buffer[3]);

    bit_ctx->pos += 4;

    bit_ctx->streamEndPos = len;
    bit_ctx->strmError = bit_ctx->pos > bit_ctx->streamEndPos;

    FUN_T("FUN_OUT");
}